

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

void __thiscall
spvtools::opt::BasicBlock::ForEachSuccessorLabel(BasicBlock *this,function<void_(unsigned_int)> *f)

{
  function<void_(unsigned_int)> local_58;
  function<bool_(unsigned_int)> local_38;
  function<void_(unsigned_int)> *local_18;
  function<void_(unsigned_int)> *f_local;
  BasicBlock *this_local;
  
  local_18 = f;
  f_local = (function<void_(unsigned_int)> *)this;
  std::function<void_(unsigned_int)>::function(&local_58,f);
  std::function<bool(unsigned_int)>::
  function<spvtools::opt::BasicBlock::ForEachSuccessorLabel(std::function<void(unsigned_int)>const&)const::__0,void>
            ((function<bool(unsigned_int)> *)&local_38,(anon_class_32_1_54a39806 *)&local_58);
  WhileEachSuccessorLabel(this,&local_38);
  std::function<bool_(unsigned_int)>::~function(&local_38);
  ForEachSuccessorLabel(std::function<void(unsigned_int)>const&)::~__0
            ((ForEachSuccessorLabel_std__function<void(unsigned_int)>const__ *)&local_58);
  return;
}

Assistant:

void BasicBlock::ForEachSuccessorLabel(
    const std::function<void(const uint32_t)>& f) const {
  WhileEachSuccessorLabel([f](const uint32_t l) {
    f(l);
    return true;
  });
}